

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_compare_distr(Integer g_a,Integer g_b)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int handle;
  int handle_00;
  bool bVar8;
  char err_string [256];
  char local_138 [264];
  
  handle = (int)g_a + 1000;
  handle_00 = (int)g_b + 1000;
  uVar3 = calc_maplen(handle);
  uVar4 = calc_maplen(handle_00);
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","distribution a");
    pnga_error(local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","distribution a");
    pnga_error(local_138,g_a);
  }
  if ((g_b < -1000) || ((long)_max_global_array <= g_b + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","distribution b");
    pnga_error(local_138,g_b);
  }
  if (GA[g_b + 1000].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","distribution b");
    pnga_error(local_138,g_b);
  }
  sVar1 = GA[handle].ndim;
  uVar6 = (uint)sVar1;
  if (sVar1 == GA[handle_00].ndim) {
    if (0 < sVar1) {
      uVar7 = 0;
      do {
        if (GA[handle].dims[uVar7] != GA[handle_00].dims[uVar7]) {
          return 0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    uVar2 = GA[handle].distr_type;
    if (uVar2 == GA[handle_00].distr_type) {
      if (uVar2 - 1 < 3) {
        if (0 < sVar1) {
          uVar7 = 0;
          do {
            if (GA[handle].block_dims[uVar7] != GA[handle_00].block_dims[uVar7]) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        if (0 < sVar1) {
          uVar7 = 0;
          do {
            if (GA[handle].num_blocks[uVar7] != GA[handle_00].num_blocks[uVar7]) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        if (0 < sVar1 && (uVar2 & 0xfffffffe) == 2) {
          uVar7 = 0;
          do {
            if (GA[handle].nblock[uVar7] != GA[handle_00].nblock[uVar7]) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      else if (uVar2 == 4) {
        if (uVar3 != uVar4) {
          return 0;
        }
        if (0 < (int)uVar3) {
          lVar5 = 0;
          do {
            if (GA[handle].mapc[lVar5] != GA[handle_00].mapc[lVar5]) {
              return 0;
            }
          } while ((GA[handle].mapc[lVar5] != -1) &&
                  (bVar8 = (ulong)uVar3 - 1 != lVar5, lVar5 = lVar5 + 1, bVar8));
        }
        if (0 < sVar1) {
          uVar7 = 0;
          do {
            if (GA[handle].nblock[uVar7] != GA[handle_00].nblock[uVar7]) {
              return 0;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      else if (uVar2 == 0) {
        if (uVar3 != uVar4) {
          return 0;
        }
        if (0 < (int)uVar3) {
          lVar5 = 0;
          do {
            if (GA[handle].mapc[lVar5] != GA[handle_00].mapc[lVar5]) {
              return 0;
            }
          } while ((GA[handle].mapc[lVar5] != -1) &&
                  (bVar8 = (ulong)uVar3 - 1 != lVar5, lVar5 = lVar5 + 1, bVar8));
        }
      }
      if (GA[handle].num_rstrctd == GA[handle_00].num_rstrctd) {
        if (GA[handle].num_rstrctd < 1) {
          return 1;
        }
        if (GA[handle].num_rstrctd < 1) {
          return 1;
        }
        lVar5 = 0;
        while (GA[handle].rstrctd_list[lVar5] == GA[handle_00].rstrctd_list[lVar5]) {
          lVar5 = lVar5 + 1;
          if (GA[handle].num_rstrctd == lVar5) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

logical pnga_compare_distr(Integer g_a, Integer g_b)
{
int h_a =(int)g_a + GA_OFFSET;
int h_b =(int)g_b + GA_OFFSET;
int h_a_maplen = calc_maplen(h_a);
int h_b_maplen = calc_maplen(h_b);
int i;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   ga_check_handleM(g_a, "distribution a");
   ga_check_handleM(g_b, "distribution b");
   

   if(GA[h_a].ndim != GA[h_b].ndim) return FALSE; 

   for(i=0; i <GA[h_a].ndim; i++)
       if(GA[h_a].dims[i] != GA[h_b].dims[i]) return FALSE;

   if (GA[h_a].distr_type != GA[h_b].distr_type) return FALSE;
   if (GA[h_a].distr_type == REGULAR) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
   } else if (GA[h_a].distr_type == BLOCK_CYCLIC ||
       GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].block_dims[i] != GA[h_b].block_dims[i]) return FALSE;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].num_blocks[i] != GA[h_b].num_blocks[i]) return FALSE;
     }
     if (GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
       for (i=0; i<GA[h_a].ndim; i++) {
         if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
       }
     }
   } else if (GA[h_a].distr_type == TILED_IRREG) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
     }
   }
   if (GA[h_a].num_rstrctd == GA[h_b].num_rstrctd) {
     if (GA[h_a].num_rstrctd > 0) {
       for (i=0; i<GA[h_a].num_rstrctd; i++) {
         if (GA[h_a].rstrctd_list[i] != GA[h_b].rstrctd_list[i]) return FALSE;
       }
     }
   } else {
     return FALSE;
   }
   return TRUE;
}